

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

bool __thiscall
slang::ast::MethodPrototypeSymbol::checkMethodMatch
          (MethodPrototypeSymbol *this,Scope *scope,SubroutineSymbol *method)

{
  FormalArgumentSymbol *pFVar1;
  FormalArgumentSymbol *pFVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  SourceRange sourceRange;
  bool bVar3;
  DataTypeSyntax *pDVar4;
  Diagnostic *this_00;
  Diagnostic *pDVar5;
  reference ppFVar6;
  long in_RDX;
  SourceLocation in_RSI;
  long in_RDI;
  Diagnostic *diag_5;
  Diagnostic *diag_4;
  Type *pt;
  Type *dt;
  Diagnostic *diag_3;
  FormalArgumentSymbol *pa;
  FormalArgumentSymbol *da;
  iterator pi;
  iterator di;
  Diagnostic *diag_2;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> protoArgs;
  ArgList defArgs;
  DataTypeSyntax *typeSyntax;
  Diagnostic *diag_1;
  Type *defRetType;
  Type *protoRetType;
  Diagnostic *diag;
  SubroutineSymbol *in_stack_fffffffffffffdb8;
  Diagnostic *in_stack_fffffffffffffdc0;
  SourceLocation in_stack_fffffffffffffdc8;
  DiagCode noteCode;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  in_stack_fffffffffffffdd8;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  Diagnostic *in_stack_fffffffffffffe00;
  Type *in_stack_fffffffffffffe08;
  SourceLocation SVar7;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 uVar8;
  Type *in_stack_fffffffffffffe60;
  SourceLocation in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  DiagCode in_stack_fffffffffffffe74;
  Type *in_stack_fffffffffffffe78;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  local_118;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  local_110;
  Scope *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  SourceLocation in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  DiagCode DVar9;
  bool local_1;
  
  DVar9 = SUB84((ulong)in_stack_ffffffffffffff10 >> 0x20,0);
  if (*(int *)(in_RDX + 0xbc) == *(int *)(in_RDI + 0xb8)) {
    getReturnType((MethodPrototypeSymbol *)0x9c40ec);
    SubroutineSymbol::getReturnType((SubroutineSymbol *)0x9c4101);
    bVar3 = Type::isMatching(in_stack_fffffffffffffe78,
                             (Type *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    if (((bVar3) || (bVar3 = Type::isError((Type *)0x9c4133), bVar3)) ||
       (bVar3 = Type::isError((Type *)0x9c4148), bVar3)) {
      SubroutineSymbol::getArguments(in_stack_fffffffffffffdb8);
      this_00 = (Diagnostic *)
                std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
                size((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                     0x9c4316);
      pDVar5 = (Diagnostic *)
               std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
               size((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                    0x9c4328);
      DVar9 = SUB84((ulong)in_RDI >> 0x20,0);
      if (this_00 == pDVar5) {
        local_110._M_current =
             (FormalArgumentSymbol **)
             std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                       ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                         *)in_stack_fffffffffffffdb8);
        local_118._M_current =
             (FormalArgumentSymbol **)
             std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                       ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                         *)in_stack_fffffffffffffdb8);
        while( true ) {
          std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
                    ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                     in_stack_fffffffffffffdc8);
          bVar3 = __gnu_cxx::
                  operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                            ((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                              *)this_00,
                             (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                              *)in_stack_fffffffffffffdb8);
          if (((bVar3 ^ 0xffU) & 1) == 0) break;
          ppFVar6 = __gnu_cxx::
                    __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                    ::operator*(&local_110);
          pFVar1 = *ppFVar6;
          ppFVar6 = __gnu_cxx::
                    __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                    ::operator*(&local_118);
          pFVar2 = *ppFVar6;
          bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            (&(pFVar1->super_VariableSymbol).super_ValueSymbol.super_Symbol.name);
          if (!bVar3) {
            __x._M_str._0_4_ = in_stack_fffffffffffffdf0;
            __x._M_len = in_stack_fffffffffffffde8;
            __x._M_str._4_4_ = in_stack_fffffffffffffdf4;
            __y._M_str = (char *)in_stack_fffffffffffffde0._M_current;
            __y._M_len = (size_t)in_stack_fffffffffffffdd8._M_current;
            bVar3 = std::operator==(__x,__y);
            if (((bVar3 ^ 0xffU) & 1) != 0) {
              bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                (&(pFVar2->super_VariableSymbol).super_ValueSymbol.super_Symbol.name
                                );
              DVar9 = SUB84((ulong)in_RDI >> 0x20,0);
              if (!bVar3) {
                Scope::addDiag((Scope *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe74,
                               in_stack_fffffffffffffe68);
                arg_01._M_str._0_4_ = in_stack_fffffffffffffe10;
                arg_01._M_len = (size_t)in_stack_fffffffffffffe08;
                arg_01._M_str._4_4_ = in_stack_fffffffffffffe14;
                Diagnostic::operator<<(in_stack_fffffffffffffe00,arg_01);
                arg_02._M_str._0_4_ = in_stack_fffffffffffffe10;
                arg_02._M_len = (size_t)in_stack_fffffffffffffe08;
                arg_02._M_str._4_4_ = in_stack_fffffffffffffe14;
                Diagnostic::operator<<(in_stack_fffffffffffffe00,arg_02);
                Diagnostic::addNote(this_00,DVar9,in_stack_fffffffffffffdc8);
                return false;
              }
            }
            in_stack_fffffffffffffe60 = ValueSymbol::getType((ValueSymbol *)0x9c4647);
            ValueSymbol::getType((ValueSymbol *)0x9c465c);
            bVar3 = Type::isMatching(in_stack_fffffffffffffe78,
                                     (Type *)CONCAT44(in_stack_fffffffffffffe74,
                                                      in_stack_fffffffffffffe70));
            if ((!bVar3) && (bVar3 = Type::isError((Type *)0x9c468e), !bVar3)) {
              bVar3 = Type::isError((Type *)0x9c46a3);
              DVar9 = SUB84((ulong)in_RDI >> 0x20,0);
              if (!bVar3) {
                Scope::addDiag((Scope *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe74,
                               in_stack_fffffffffffffe68);
                arg_03._M_str._0_4_ = in_stack_fffffffffffffe10;
                arg_03._M_len = (size_t)in_stack_fffffffffffffe08;
                arg_03._M_str._4_4_ = in_stack_fffffffffffffe14;
                Diagnostic::operator<<(in_stack_fffffffffffffe00,arg_03);
                ast::operator<<((Diagnostic *)
                                CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                in_stack_fffffffffffffe08);
                ast::operator<<((Diagnostic *)
                                CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                in_stack_fffffffffffffe08);
                Diagnostic::addNote(this_00,DVar9,in_stack_fffffffffffffdc8);
                return false;
              }
            }
            DVar9 = SUB84((ulong)in_RDI >> 0x20,0);
            if (pFVar1->direction != pFVar2->direction) {
              uVar8 = 0x710006;
              SVar7 = (pFVar1->super_VariableSymbol).super_ValueSymbol.super_Symbol.location;
              Scope::addDiag((Scope *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe74,
                             in_stack_fffffffffffffe68);
              arg_04._M_str._0_4_ = in_stack_fffffffffffffe10;
              arg_04._M_len = (size_t)SVar7;
              arg_04._M_str._4_4_ = uVar8;
              Diagnostic::operator<<
                        ((Diagnostic *)
                         (pFVar1->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_str,
                         arg_04);
              Diagnostic::addNote(this_00,DVar9,in_stack_fffffffffffffdc8);
              return false;
            }
          }
          in_stack_fffffffffffffde0 =
               __gnu_cxx::
               __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
               ::operator++((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffdc8,(int)((ulong)this_00 >> 0x20));
          in_stack_fffffffffffffdd8 =
               __gnu_cxx::
               __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
               ::operator++((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffdc8,(int)((ulong)this_00 >> 0x20));
        }
        local_1 = true;
      }
      else {
        Scope::addDiag((Scope *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe74,
                       in_stack_fffffffffffffe68);
        arg_00._M_str._0_4_ = in_stack_fffffffffffffe10;
        arg_00._M_len = (size_t)in_stack_fffffffffffffe08;
        arg_00._M_str._4_4_ = in_stack_fffffffffffffe14;
        Diagnostic::operator<<(in_stack_fffffffffffffe00,arg_00);
        Diagnostic::addNote(this_00,DVar9,in_stack_fffffffffffffdc8);
        local_1 = false;
      }
    }
    else {
      pDVar4 = DeclaredType::getTypeSyntax((DeclaredType *)(in_RDI + 0x78));
      noteCode = SUB84((ulong)in_RDI >> 0x20,0);
      if (pDVar4 == (DataTypeSyntax *)0x0) {
        Scope::addDiag((Scope *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe74,
                       in_stack_fffffffffffffe68);
      }
      else {
        slang::syntax::SyntaxNode::sourceRange
                  ((SyntaxNode *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        sourceRange.startLoc._4_4_ = in_stack_ffffffffffffff04;
        sourceRange.startLoc._0_4_ = in_stack_ffffffffffffff00;
        sourceRange.endLoc = in_stack_ffffffffffffff08;
        Scope::addDiag(in_stack_fffffffffffffef8,DVar9,sourceRange);
        in_stack_fffffffffffffdc8 = in_RSI;
      }
      ast::operator<<((Diagnostic *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                      in_stack_fffffffffffffe08);
      arg._M_str._0_4_ = in_stack_fffffffffffffe10;
      arg._M_len = (size_t)in_stack_fffffffffffffe08;
      arg._M_str._4_4_ = in_stack_fffffffffffffe14;
      Diagnostic::operator<<(in_stack_fffffffffffffe00,arg);
      ast::operator<<((Diagnostic *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                      in_stack_fffffffffffffe08);
      Diagnostic::addNote(in_stack_fffffffffffffdc0,noteCode,in_stack_fffffffffffffdc8);
      local_1 = false;
    }
  }
  else {
    Scope::addDiag((Scope *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe74,
                   in_stack_fffffffffffffe68);
    Diagnostic::addNote(in_stack_fffffffffffffdc0,SUB84((ulong)in_RDI >> 0x20,0),
                        in_stack_fffffffffffffdc8);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MethodPrototypeSymbol::checkMethodMatch(const Scope& scope,
                                             const SubroutineSymbol& method) const {
    if (method.subroutineKind != subroutineKind) {
        auto& diag = scope.addDiag(diag::MethodKindMismatch, location);
        diag.addNote(diag::NoteDeclarationHere, method.location);
        return false;
    }

    // Check that return type and arguments match what was declared in the prototype.
    auto& protoRetType = getReturnType();
    auto& defRetType = method.getReturnType();
    if (!defRetType.isMatching(protoRetType) && !defRetType.isError() && !protoRetType.isError()) {
        Diagnostic* diag;
        auto typeSyntax = declaredReturnType.getTypeSyntax();
        if (typeSyntax)
            diag = &scope.addDiag(diag::MethodReturnMismatch, typeSyntax->sourceRange());
        else
            diag = &scope.addDiag(diag::MethodReturnMismatch, location);

        (*diag) << defRetType;
        (*diag) << method.name;
        (*diag) << protoRetType;
        diag->addNote(diag::NoteDeclarationHere, method.location);
        return false;
    }

    auto defArgs = method.getArguments();
    auto protoArgs = arguments;
    if (defArgs.size() != protoArgs.size()) {
        auto& diag = scope.addDiag(diag::MethodArgCountMismatch, method.location);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, location);
        return false;
    }

    for (auto di = defArgs.begin(), pi = protoArgs.begin(); di != defArgs.end(); di++, pi++) {
        // Names must be identical.
        const FormalArgumentSymbol* da = *di;
        const FormalArgumentSymbol* pa = *pi;

        // The subroutine itself shouldn't have empty argument names.
        // If it does the parser already errored.
        if (da->name.empty())
            continue;

        if (da->name != pa->name && !pa->name.empty()) {
            auto& diag = scope.addDiag(diag::MethodArgNameMismatch, da->location);
            diag << da->name << pa->name;
            diag.addNote(diag::NoteDeclarationHere, pa->location);
            return false;
        }

        // Types must match.
        const Type& dt = da->getType();
        const Type& pt = pa->getType();
        if (!dt.isMatching(pt) && !dt.isError() && !pt.isError()) {
            auto& diag = scope.addDiag(diag::MethodArgTypeMismatch, da->location);
            diag << da->name << dt << pt;
            diag.addNote(diag::NoteDeclarationHere, pa->location);
            return false;
        }

        // Direction must match.
        if (da->direction != pa->direction) {
            auto& diag = scope.addDiag(diag::MethodArgDirectionMismatch, da->location);
            diag << da->name;
            diag.addNote(diag::NoteDeclarationHere, pa->location);
            return false;
        }
    }

    return true;
}